

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::AddPackage(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::FileDescriptor*,bool)::__1,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  undefined8 *puVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  undefined8 local_58;
  char *local_50;
  undefined8 local_48;
  size_type local_40;
  undefined8 local_38;
  char *local_30;
  undefined8 local_28;
  char *local_20;
  undefined8 local_18;
  char *local_10;
  
  local_48 = **(undefined8 **)this;
  local_40 = (*(undefined8 **)this)[1];
  if (**(long **)(this + 8) == 0) {
    local_20 = "null";
    local_28 = 4;
  }
  else {
    puVar1 = *(undefined8 **)(**(long **)(this + 8) + 8);
    local_20 = (char *)*puVar1;
    local_28 = puVar1[1];
  }
  local_58 = 1;
  local_50 = "\"";
  local_38 = 0x42;
  local_30 = "\" is already defined (as something other than a package) in file \"";
  local_18 = 2;
  local_10 = "\".";
  pieces._M_len = local_40;
  pieces._M_array = (iterator)0x5;
  strings_internal::CatPieces_abi_cxx11_
            (__return_storage_ptr__,(strings_internal *)&local_58,pieces);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}